

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool __thiscall JetHead::Path::isDir(Path *this)

{
  bool bVar1;
  int iVar2;
  stat buf;
  stat local_90;
  
  iVar2 = stat((this->mPath)._M_dataplus._M_p,&local_90);
  if ((iVar2 != 0) || (bVar1 = true, (local_90.st_mode._1_1_ & 0x40) == 0)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Path::isDir()
{
	struct stat buf;
	
	int res = stat( mPath.c_str(), &buf );
	
	if ( res == 0 && (buf.st_mode & S_IFDIR) )
		return true;
	else 
		return false;
}